

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_mul.c
# Opt level: O2

word zzDivW(word *q,word *a,size_t n,word w)

{
  word wVar1;
  word wVar2;
  bool bVar3;
  
  wVar2 = 0;
  while (bVar3 = n != 0, n = n - 1, bVar3) {
    wVar1 = a[n];
    wVar2 = __udivti3(wVar1,wVar2,w,0);
    q[n] = wVar2;
    wVar2 = wVar1 - wVar2 * w;
  }
  return wVar2;
}

Assistant:

word zzDivW(word q[], const word a[], size_t n, register word w)
{
	register word r = 0;
	register dword divisor;
	ASSERT(w > 0);
	ASSERT(wwIsSameOrDisjoint(a, q, n));
	while (n--)
	{
		divisor = r;
		divisor <<= B_PER_W;
		divisor |= a[n];
		q[n] = (word)(divisor / w);
		r = (word)(divisor % w);
	}
	divisor = 0, w = 0;
	return r;
}